

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           *this)

{
  ulong capacity;
  slot_type *psVar1;
  undefined8 uVar2;
  slot_type *psVar3;
  undefined1 auVar4 [16];
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  size_t pos;
  size_t sVar8;
  size_t sVar9;
  byte bVar10;
  size_t pos_00;
  long lVar11;
  FindInfo FVar12;
  size_t hash;
  anon_class_16_2_3fe0aac9 probe_index;
  type raw;
  
  capacity = this->capacity_;
  if ((capacity == 0) || ((capacity + 1 & capacity) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x748,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>]"
                 );
  }
  if (capacity < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x749,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>]"
                 );
  }
  ConvertDeletedToEmptyAndFullToDeleted(this->ctrl_,capacity);
  pos_00 = 0;
  do {
    if (pos_00 == this->capacity_) {
      reset_growth_left(this);
      return;
    }
    if (this->ctrl_[pos_00] == -2) {
      lVar11 = pos_00 * 0x18;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = this->slots_[pos_00].value.first;
      hash = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar4,8) +
             SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar4,0);
      FVar12 = find_first_non_full(this,hash);
      pos = FVar12.offset;
      probe_index.hash = &hash;
      probe_index.this = this;
      sVar8 = drop_deletes_without_resize::anon_class_16_2_3fe0aac9::operator()(&probe_index,pos);
      sVar9 = drop_deletes_without_resize::anon_class_16_2_3fe0aac9::operator()(&probe_index,pos_00)
      ;
      bVar10 = (byte)hash;
      if (sVar8 == sVar9) {
        bVar10 = bVar10 & 0x7f;
      }
      else {
        if (this->ctrl_[pos] == -2) {
          set_ctrl(this,pos,bVar10 & 0x7f);
          psVar1 = this->slots_;
          uVar2 = *(undefined8 *)((long)psVar1 + lVar11 + 0x10);
          uVar5 = psVar1[pos_00].value.first;
          uVar6 = psVar1[pos_00].value.second.first;
          uVar7 = psVar1[pos].value.second.first;
          psVar1[pos_00].value.first = psVar1[pos].value.first;
          psVar1[pos_00].value.second.first = uVar7;
          *(undefined8 *)((long)psVar1 + lVar11 + 0x10) =
               *(undefined8 *)((long)psVar1 + pos * 0x18 + 0x10);
          psVar3 = this->slots_;
          psVar1 = psVar3 + pos;
          (psVar1->value).first = uVar5;
          (psVar1->value).second.first = uVar6;
          *(undefined8 *)((long)psVar3 + pos * 0x18 + 0x10) = uVar2;
          pos_00 = pos_00 - 1;
          goto LAB_00111afe;
        }
        if (this->ctrl_[pos] != -0x80) {
          __assert_fail("IsDeleted(ctrl_[new_i])",
                        "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x779,
                        "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::pair<unsigned long, unsigned long>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::pair<unsigned long, unsigned long>>>]"
                       );
        }
        set_ctrl(this,pos,bVar10 & 0x7f);
        psVar1 = this->slots_;
        *(undefined8 *)((long)psVar1 + pos * 0x18 + 0x10) =
             *(undefined8 *)((long)psVar1 + lVar11 + 0x10);
        uVar5 = psVar1[pos_00].value.second.first;
        psVar1[pos].value.first = psVar1[pos_00].value.first;
        psVar1[pos].value.second.first = uVar5;
        bVar10 = 0x80;
      }
      set_ctrl(this,pos_00,bVar10);
    }
LAB_00111afe:
    pos_00 = pos_00 + 1;
  } while( true );
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename std::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hash = PolicyTraits::apply(HashElement{hash_ref()},
                                              PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hash);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hash.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hash).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hash));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hash));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hash));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left();
    }